

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic20::UnitTest_semantic20(UnitTest_semantic20 *this)

{
  undefined8 *in_RDI;
  UnitTestBase *unaff_retaddr;
  
  UnitTestBase::UnitTestBase(unaff_retaddr);
  *in_RDI = &PTR_Run_002694b0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"semantic20");
  return;
}

Assistant:

TEST_CASE(semantic20)
{
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("do break end");
    });

    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("while true do local f = function() break end end");
    });

    auto ast = Semantic("while true do break end");
    auto b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto w = ASTFind<luna::WhileStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == w);

    ast = Semantic("repeat break until true");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto r = ASTFind<luna::RepeatStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == r);

    ast = Semantic("for i = 1, 10 do break end");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto nf = ASTFind<luna::NumericForStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == nf);

    ast = Semantic("for k, v in pairs(t) do break end");
    b = ASTFind<luna::BreakStatement>(ast, AcceptAST());
    auto gf = ASTFind<luna::GenericForStatement>(ast, AcceptAST());
    EXPECT_TRUE(b->loop_ == gf);
}